

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdm.cpp
# Opt level: O3

void __thiscall FDMEulerExplicit::step_march(FDMEulerExplicit *this)

{
  double *pdVar1;
  vector<double,_std::allocator<double>_> *__x;
  ostream *poVar2;
  ulong uVar3;
  double dVar4;
  ofstream fdm_out;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,"fdm.csv",_S_out);
  dVar4 = (this->super_FDMBase).t_dom;
  pdVar1 = &(this->super_FDMBase).cur_t;
  if (*pdVar1 <= dVar4 && dVar4 != *pdVar1) {
    __x = &(this->super_FDMBase).new_result;
    dVar4 = (this->super_FDMBase).prev_t;
    do {
      (this->super_FDMBase).cur_t = dVar4 + (this->super_FDMBase).dt;
      (*(this->super_FDMBase)._vptr_FDMBase[2])(this);
      (*(this->super_FDMBase)._vptr_FDMBase[3])(this);
      if ((this->super_FDMBase).J != 0) {
        uVar3 = 0;
        do {
          poVar2 = std::ostream::_M_insert<double>
                             ((this->super_FDMBase).x_values.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar3]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
          poVar2 = std::ostream::_M_insert<double>((this->super_FDMBase).prev_t);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
          poVar2 = std::ostream::_M_insert<double>
                             ((__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_start[uVar3]);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
          uVar3 = uVar3 + 1;
        } while (uVar3 < (this->super_FDMBase).J);
      }
      std::vector<double,_std::allocator<double>_>::operator=(&(this->super_FDMBase).old_result,__x)
      ;
      dVar4 = (this->super_FDMBase).cur_t;
      (this->super_FDMBase).prev_t = dVar4;
    } while (dVar4 < (this->super_FDMBase).t_dom);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _widen;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void FDMEulerExplicit::step_march()
{
    std::ofstream fdm_out("fdm.csv");

    while(cur_t < t_dom)
    {
        cur_t = prev_t + dt;
        calculate_boundary_conditions();
        calculate_inner_domain();
        for (int j=0; j<J; j++)
        {
            fdm_out << x_values[j] << " " << prev_t << " " << new_result[j] << std::endl;
        }

        old_result = new_result;
        prev_t = cur_t;
    }
    fdm_out.close();
}